

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O0

void * v2i_crld(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  DIST_POINT *pDVar1;
  CONF_VALUE *cnf_00;
  stack_st_CONF_VALUE *nval_00;
  DIST_POINT *pDVar2;
  size_t sVar3;
  DIST_POINT_NAME *pDVar4;
  stack_st_CONF_VALUE *dpsect;
  CONF_VALUE *cnf;
  DIST_POINT *point;
  size_t i;
  GENERAL_NAME *gen;
  GENERAL_NAMES *gens;
  stack_st_DIST_POINT *crld;
  stack_st_CONF_VALUE *nval_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  gen = (GENERAL_NAME *)0x0;
  i = 0;
  method_local = (X509V3_EXT_METHOD *)sk_DIST_POINT_new_null();
  if (method_local == (X509V3_EXT_METHOD *)0x0) {
LAB_00315b31:
    GENERAL_NAME_free((GENERAL_NAME *)i);
    GENERAL_NAMES_free((GENERAL_NAMES *)gen);
    sk_DIST_POINT_pop_free((stack_st_DIST_POINT *)method_local,DIST_POINT_free);
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    point = (DIST_POINT *)0x0;
    while( true ) {
      gen = (GENERAL_NAME *)0x0;
      i = 0;
      pDVar1 = (DIST_POINT *)sk_CONF_VALUE_num(nval);
      if (pDVar1 <= point) break;
      cnf_00 = sk_CONF_VALUE_value(nval,(size_t)point);
      if (cnf_00->value == (char *)0x0) {
        nval_00 = (stack_st_CONF_VALUE *)X509V3_get_section((X509V3_CTX *)ctx,cnf_00->name);
        if ((nval_00 == (stack_st_CONF_VALUE *)0x0) ||
           (pDVar2 = (DIST_POINT *)crldp_from_section(ctx,nval_00), pDVar2 == (DIST_POINT *)0x0))
        goto LAB_00315b31;
        sVar3 = sk_DIST_POINT_push((stack_st_DIST_POINT *)method_local,(DIST_POINT *)pDVar2);
        if (sVar3 == 0) {
          DIST_POINT_free(pDVar2);
          goto LAB_00315b31;
        }
      }
      else {
        i = (size_t)v2i_GENERAL_NAME((X509V3_EXT_METHOD *)method,(X509V3_CTX *)ctx,
                                     (CONF_VALUE *)cnf_00);
        if ((((GENERAL_NAME *)i == (GENERAL_NAME *)0x0) ||
            (gen = (GENERAL_NAME *)GENERAL_NAMES_new(), gen == (GENERAL_NAME *)0x0)) ||
           (sVar3 = sk_GENERAL_NAME_push((stack_st_GENERAL_NAME *)gen,(GENERAL_NAME *)i), sVar3 == 0
           )) goto LAB_00315b31;
        i = 0;
        pDVar2 = DIST_POINT_new();
        if (pDVar2 == (DIST_POINT *)0x0) goto LAB_00315b31;
        sVar3 = sk_DIST_POINT_push((stack_st_DIST_POINT *)method_local,(DIST_POINT *)pDVar2);
        if (sVar3 == 0) {
          DIST_POINT_free(pDVar2);
          goto LAB_00315b31;
        }
        pDVar4 = DIST_POINT_NAME_new();
        pDVar2->distpoint = pDVar4;
        if (pDVar4 == (DIST_POINT_NAME *)0x0) goto LAB_00315b31;
        (pDVar2->distpoint->name).fullname = (GENERAL_NAMES *)gen;
        pDVar2->distpoint->type = 0;
      }
      point = (DIST_POINT *)((long)&point->distpoint + 1);
    }
  }
  return method_local;
}

Assistant:

static void *v2i_crld(const X509V3_EXT_METHOD *method, const X509V3_CTX *ctx,
                      const STACK_OF(CONF_VALUE) *nval) {
  STACK_OF(DIST_POINT) *crld = NULL;
  GENERAL_NAMES *gens = NULL;
  GENERAL_NAME *gen = NULL;
  if (!(crld = sk_DIST_POINT_new_null())) {
    goto err;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    DIST_POINT *point;
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    if (!cnf->value) {
      const STACK_OF(CONF_VALUE) *dpsect = X509V3_get_section(ctx, cnf->name);
      if (!dpsect) {
        goto err;
      }
      point = crldp_from_section(ctx, dpsect);
      if (!point) {
        goto err;
      }
      if (!sk_DIST_POINT_push(crld, point)) {
        DIST_POINT_free(point);
        goto err;
      }
    } else {
      if (!(gen = v2i_GENERAL_NAME(method, ctx, cnf))) {
        goto err;
      }
      if (!(gens = GENERAL_NAMES_new())) {
        goto err;
      }
      if (!sk_GENERAL_NAME_push(gens, gen)) {
        goto err;
      }
      gen = NULL;
      if (!(point = DIST_POINT_new())) {
        goto err;
      }
      if (!sk_DIST_POINT_push(crld, point)) {
        DIST_POINT_free(point);
        goto err;
      }
      if (!(point->distpoint = DIST_POINT_NAME_new())) {
        goto err;
      }
      point->distpoint->name.fullname = gens;
      point->distpoint->type = 0;
      gens = NULL;
    }
  }
  return crld;

err:
  GENERAL_NAME_free(gen);
  GENERAL_NAMES_free(gens);
  sk_DIST_POINT_pop_free(crld, DIST_POINT_free);
  return NULL;
}